

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_update_local_initial_window_size
              (nghttp2_session *session,int32_t new_initial_window_size,
              int32_t old_initial_window_size)

{
  int iVar1;
  nghttp2_session *local_28;
  nghttp2_update_window_size_arg arg;
  int32_t old_initial_window_size_local;
  int32_t new_initial_window_size_local;
  nghttp2_session *session_local;
  
  local_28 = session;
  arg.session._0_4_ = new_initial_window_size;
  arg.session._4_4_ = old_initial_window_size;
  arg.new_window_size = old_initial_window_size;
  arg.old_window_size = new_initial_window_size;
  iVar1 = nghttp2_map_each(&session->streams,update_local_initial_window_size_func,&local_28);
  return iVar1;
}

Assistant:

static int
session_update_local_initial_window_size(nghttp2_session *session,
                                         int32_t new_initial_window_size,
                                         int32_t old_initial_window_size) {
  nghttp2_update_window_size_arg arg;
  arg.session = session;
  arg.new_window_size = new_initial_window_size;
  arg.old_window_size = old_initial_window_size;
  return nghttp2_map_each(&session->streams,
                          update_local_initial_window_size_func, &arg);
}